

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::QCborValue(QCborValue *this,QLatin1StringView s)

{
  long lVar1;
  QCborContainerPrivate *this_00;
  QCborContainerPrivate *in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000050 [16];
  int in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  QCborContainerPrivate::QCborContainerPrivate(this_00);
  in_RDI[1] = this_00;
  *(undefined4 *)(in_RDI + 2) = 0x60;
  QCborContainerPrivate::append(in_RDX,(QLatin1StringView)in_stack_00000050);
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)this_00,in_stack_ffffffffffffffbc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue::QCborValue(QLatin1StringView s)
    : n(0), container(new QCborContainerPrivate), t(String)
{
    container->append(s);
    container->ref.storeRelaxed(1);
}